

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O2

void __thiscall QHybrid::Compute(QHybrid *this)

{
  QFunctionJointBeliefInterface *pQVar1;
  
  if (this->_m_initialized == false) {
    Initialize(this);
  }
  pQVar1 = this->_m_QlastTimeSteps;
  if (pQVar1 != (QFunctionJointBeliefInterface *)0x0) {
    (**(code **)(*(long *)((long)&pQVar1->field_0x0 + *(long *)((long)*pQVar1 + -0x60)) + 0x10))
              ((long)&pQVar1->field_0x0 + *(long *)((long)*pQVar1 + -0x60));
  }
  ComputeQ(this);
  return;
}

Assistant:

void QHybrid::Compute()
{
    if(!_m_initialized)
        Initialize();

    // first compute the heuristic for the final time steps, as we
    // will use these values for the backup
    if(_m_QlastTimeSteps)
        _m_QlastTimeSteps->Compute();

    ComputeQ();
}